

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

size_t rtosc_scan_arg_vals(char *src,rtosc_arg_val_t *args,size_t n,char *buffer_for_strings,
                          size_t bufsize)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  ushort **ppuVar6;
  char *fmt;
  size_t sVar7;
  ulong args_before;
  size_t local_68;
  rtosc_arg_val_t *local_60;
  char *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  char *local_38;
  
  sVar7 = 0;
  args_before = 0;
  local_68 = bufsize;
  local_50 = n;
  while (sVar2 = local_68, args_before <= local_50 && local_50 - args_before != 0) {
    local_60 = args;
    local_38 = buffer_for_strings;
    sVar4 = rtosc_scan_arg_val(src,args,local_50 - args_before,buffer_for_strings,&local_68,
                               args_before,1);
    local_58 = src + sVar4;
    sVar7 = sVar7 + sVar4;
    iVar3 = next_arg_offset(local_60);
    local_48 = (long)iVar3;
    local_40 = args_before + local_48;
    lVar5 = sVar2 - local_68;
    fmt = " %n";
    do {
      do {
        iVar3 = skip_fmt(&local_58,fmt);
        src = local_58;
        sVar7 = sVar7 + (long)iVar3;
        cVar1 = *local_58;
        fmt = "%*[^\n]%n";
      } while ((long)cVar1 == 0x25);
      ppuVar6 = __ctype_b_loc();
      fmt = " %n";
    } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    args = local_60 + local_48;
    buffer_for_strings = local_38 + lVar5;
    args_before = local_40;
  }
  return sVar7;
}

Assistant:

size_t rtosc_scan_arg_vals(const char* src,
                           rtosc_arg_val_t *args, size_t n,
                           char* buffer_for_strings, size_t bufsize)
{
    size_t last_bufsize;
    size_t rd=0;
    for(size_t i = 0; i < n; )
    {
        last_bufsize = bufsize;

        size_t tmp = rtosc_scan_arg_val(src, args, n-i,
                                        buffer_for_strings, &bufsize, i, 1);
        src += tmp;
        rd += tmp;
        size_t length = next_arg_offset(args);
        i += length;
        args += length;

        size_t scanned = last_bufsize - bufsize;
        buffer_for_strings += scanned;

        do
        {
            rd += skip_fmt(&src, " %n");
            while(*src == '%')
                rd += skip_fmt(&src, "%*[^\n]%n");
        } while(isspace(*src));
    }
    return rd;
}